

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O0

void __thiscall flow::lang::Lexer::processCommand(Lexer *this,string *line)

{
  Report *this_00;
  int iVar1;
  char *__s1;
  SourceLocation *sloc;
  undefined1 local_80 [8];
  string pattern;
  allocator<char> local_49;
  string local_48;
  long local_28;
  size_t end;
  size_t beg;
  string *line_local;
  Lexer *this_local;
  
  beg = (size_t)line;
  line_local = (string *)this;
  __s1 = (char *)std::__cxx11::string::c_str();
  iVar1 = strncmp(__s1,"include",7);
  if (iVar1 == 0) {
    end = std::__cxx11::string::find((char)beg,0x22);
    local_28 = std::__cxx11::string::rfind((char)beg,0x22);
    if ((end == 0xffffffffffffffff) || (local_28 == -1)) {
      this_00 = this->report_;
      sloc = lastLocation(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"Malformed #include line",&local_49);
      diagnostics::Report::tokenError<>(this_00,sloc,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      std::allocator<char>::~allocator(&local_49);
    }
    else {
      std::__cxx11::string::substr((ulong)local_80,beg);
      enterScope(this,(string *)local_80);
      std::__cxx11::string::~string((string *)local_80);
    }
  }
  return;
}

Assistant:

void Lexer::processCommand(const std::string& line) {
  // `#include "glob"`

  if (strncmp(line.c_str(), "include", 7) != 0) return;

  // TODO this is *very* basic sub-tokenization, but it does well until properly
  // implemented.

  size_t beg = line.find('"');
  size_t end = line.rfind('"');
  if (beg == std::string::npos || end == std::string::npos) {
    report_.tokenError(lastLocation(), "Malformed #include line");
    return;
  }

  std::string pattern = line.substr(beg + 1, end - beg - 1);

#if defined(HAVE_GLOB_H)
  glob_t gl;

  int globOptions = 0;
#if defined(GLOB_TILDE)
  globOptions |= GLOB_TILDE;
#endif

  int rv = glob(pattern.c_str(), globOptions, nullptr, &gl);
  if (rv != 0) {
    static std::unordered_map<int, const char*> globErrs = {
        {GLOB_NOSPACE, "No space"},
        {GLOB_ABORTED, "Aborted"},
        {GLOB_NOMATCH, "No Match"}, };
    report_.tokenError(lastLocation(), "glob() error: {}", globErrs[rv]);
    return;
  }

  // put globbed files on stack in reverse order, to be lexed in the right order
  for (size_t i = 0; i < gl.gl_pathc; ++i) {
    const char* filename = gl.gl_pathv[gl.gl_pathc - i - 1];
    enterScope(filename);
  }

  globfree(&gl);
#else
  enterScope(pattern);
#endif
}